

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8 * google::protobuf::internal::WireFormat::InternalSerializeField
                  (FieldDescriptor *field,Message *message,uint8 *target,EpsCopyOutputStream *stream
                  )

{
  int iVar1;
  bool bVar2;
  KeyValue *pKVar3;
  bool bVar4;
  char cVar5;
  uint uVar6;
  int iVar7;
  float fVar8;
  uint uVar9;
  LogLevel LVar10;
  uint uVar11;
  MapFieldBase *pMVar12;
  RepeatedField<double> *other;
  string *psVar13;
  double dVar14;
  EnumValueDescriptor *pEVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8 *puVar16;
  RepeatedField<long> *pRVar17;
  size_t sVar18;
  RepeatedField<int> *pRVar19;
  RepeatedField<unsigned_long> *pRVar20;
  RepeatedField<float> *other_00;
  RepeatedField<bool> *other_01;
  RepeatedField<unsigned_int> *pRVar21;
  LogMessage *other_02;
  long lVar22;
  ulong uVar23;
  byte bVar24;
  uint uVar25;
  LogLevel LVar26;
  ulong uVar27;
  Reflection *this;
  MapKey *key;
  ulong uVar28;
  size_t sVar29;
  float *pfVar30;
  double *pdVar31;
  double *pdVar32;
  float *pfVar33;
  byte *pbVar34;
  byte *pbVar35;
  vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> sorted_key_list;
  MapValueRef map_value;
  undefined1 local_a8 [32];
  MapValueRef local_88;
  MapFieldBase *local_70;
  MapFieldBase *local_68;
  MapIterator local_60;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  if ((field[0x42] == (FieldDescriptor)0x1) &&
     (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x48) == '\x01')) {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60.iter_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a8,
                 (FieldDescriptor **)&local_60);
    }
    if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) &&
       (*(int *)(field + 0x3c) != 3)) {
      puVar16 = InternalSerializeMessageSetItem(field,message,target,stream);
      return puVar16;
    }
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
    local_60.iter_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a8,
               (FieldDescriptor **)&local_60);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar4 = FieldDescriptor::is_map_message_type(field), bVar4)) {
    pMVar12 = Reflection::GetMapData(this,message,field);
    bVar4 = MapFieldBase::IsMapValid(pMVar12);
    if (bVar4) {
      if (stream->is_serialization_deterministic_ == true) {
        MapKeySorter::SortKey
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   local_a8,message,this,field);
        if (local_a8._0_8_ != local_a8._8_8_) {
          key = (MapKey *)local_a8._0_8_;
          do {
            local_60.iter_ = (FieldDescriptor *)0x0;
            local_60.map_._0_4_ = 0;
            Reflection::InsertOrLookupMapValue(this,message,field,key,(MapValueRef *)&local_60);
            target = InternalSerializeMapEntry(field,key,(MapValueRef *)&local_60,target,stream);
            key = key + 1;
          } while (key != (MapKey *)local_a8._8_8_);
        }
        std::vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_>::~vector
                  ((vector<google::protobuf::MapKey,_std::allocator<google::protobuf::MapKey>_> *)
                   local_a8);
        return target;
      }
      Reflection::MapBegin((MapIterator *)local_a8,this,message,field);
      while( true ) {
        Reflection::MapEnd(&local_60,this,message,field);
        cVar5 = (**(code **)(((KeyValue *)local_a8._8_8_)->int64_value_ + 0x28))
                          (local_a8._8_8_,(MapIterator *)local_a8,&local_60);
        MapIterator::~MapIterator(&local_60);
        if (cVar5 != '\0') break;
        target = InternalSerializeMapEntry
                           (field,(MapKey *)(local_a8 + 0x10),&local_88,target,stream);
        (**(code **)(((KeyValue *)local_a8._8_8_)->int64_value_ + 0x90))
                  (local_a8._8_8_,(MapIterator *)local_a8);
      }
      MapIterator::~MapIterator((MapIterator *)local_a8);
      return target;
    }
  }
  if (*(int *)(field + 0x3c) == 3) {
    uVar6 = Reflection::FieldSize(this,message,field);
    if ((int)uVar6 < 2) goto LAB_0037e5d3;
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
      local_60.iter_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a8,
                 (FieldDescriptor **)&local_60);
    }
    if (((*(int *)(field + 0x38) != 0xb) ||
        (bVar4 = FieldDescriptor::is_map_message_type(field), !bVar4)) ||
       (stream->is_serialization_deterministic_ != true)) goto LAB_0037e5d3;
    DynamicMapSorter::Sort
              ((vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                *)local_a8,message,uVar6,this,field);
    local_70 = (MapFieldBase *)local_a8._8_8_;
    local_68 = (MapFieldBase *)local_a8._0_8_;
  }
  else {
    if (*(char *)(*(long *)(*(long *)(field + 0x50) + 0x20) + 0x4b) == '\0') {
      bVar4 = Reflection::HasField(this,message,field);
      uVar6 = (uint)bVar4;
    }
    else {
      uVar6 = 1;
    }
LAB_0037e5d3:
    local_68 = (MapFieldBase *)0x0;
    local_70 = (MapFieldBase *)0x0;
  }
  bVar4 = FieldDescriptor::is_packed(field);
  if (!bVar4) {
    if (0 < (int)uVar6) {
      uVar28 = 0;
      do {
        if (stream->end_ <= target) {
          target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
        }
        if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
          local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
          local_60.iter_ = field;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a8,
                     (FieldDescriptor **)&local_60);
        }
        iVar7 = (int)uVar28;
        switch(*(undefined4 *)(field + 0x38)) {
        case 1:
          if (*(int *)(field + 0x3c) == 3) {
            dVar14 = Reflection::GetRepeatedDouble(this,message,field,iVar7);
          }
          else {
            dVar14 = Reflection::GetDouble(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) {
            *target = (byte)uVar11 | 1;
            pdVar31 = (double *)((long)target + 1);
          }
          else {
            *target = (byte)uVar11 | 0x81;
            if (uVar11 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
              pdVar31 = (double *)((long)target + 2);
            }
            else {
              pdVar31 = (double *)((long)target + 2);
              uVar11 = uVar11 >> 7;
              do {
                pdVar32 = pdVar31;
                *(byte *)((long)pdVar32 + -1) = (byte)uVar11 | 0x80;
                uVar9 = uVar11 >> 7;
                pdVar31 = (double *)((long)pdVar32 + 1);
                bVar4 = 0x3fff < uVar11;
                uVar11 = uVar9;
              } while (bVar4);
              *(byte *)pdVar32 = (byte)uVar9;
            }
          }
          *pdVar31 = dVar14;
          goto LAB_0037f3f2;
        case 2:
          if (*(int *)(field + 0x3c) == 3) {
            fVar8 = Reflection::GetRepeatedFloat(this,message,field,iVar7);
          }
          else {
            fVar8 = Reflection::GetFloat(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) {
            *target = (byte)uVar11 | 5;
            pfVar30 = (float *)((long)target + 1);
          }
          else {
            *target = (byte)uVar11 | 0x85;
            if (uVar11 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
              pfVar30 = (float *)((long)target + 2);
            }
            else {
              pfVar30 = (float *)((long)target + 2);
              uVar11 = uVar11 >> 7;
              do {
                pfVar33 = pfVar30;
                *(byte *)((long)pfVar33 + -1) = (byte)uVar11 | 0x80;
                uVar9 = uVar11 >> 7;
                pfVar30 = (float *)((long)pfVar33 + 1);
                bVar4 = 0x3fff < uVar11;
                uVar11 = uVar9;
              } while (bVar4);
              *(byte *)pfVar33 = (byte)uVar9;
            }
          }
          *pfVar30 = fVar8;
          goto LAB_0037f49a;
        case 3:
          if (*(int *)(field + 0x3c) == 3) {
            uVar23 = Reflection::GetRepeatedInt64(this,message,field,iVar7);
          }
          else {
            uVar23 = Reflection::GetInt64(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) {
            *target = (byte)uVar11;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar11 | 0x80;
            if (uVar11 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar11 = uVar11 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar11 | 0x80;
                uVar9 = uVar11 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar11;
                uVar11 = uVar9;
              } while (bVar4);
              *pbVar34 = (byte)uVar9;
            }
          }
          if (uVar23 < 0x80) goto LAB_0037f422;
          *pbVar35 = (byte)uVar23 | 0x80;
          uVar27 = uVar23 >> 7;
          if (0x3fff < uVar23) {
            target = pbVar35 + 2;
            do {
              *(byte *)((long)target + -1) = (byte)uVar27 | 0x80;
              uVar23 = uVar27 >> 7;
              target = (uint8 *)((long)target + 1);
              bVar4 = 0x3fff < uVar27;
              uVar27 = uVar23;
            } while (bVar4);
            goto LAB_0037f3c4;
          }
LAB_0037f398:
          pbVar35[1] = (byte)uVar27;
LAB_0037f39c:
          target = pbVar35 + 2;
          break;
        case 4:
          if (*(int *)(field + 0x3c) == 3) {
            uVar23 = Reflection::GetRepeatedUInt64(this,message,field,iVar7);
          }
          else {
            uVar23 = Reflection::GetUInt64(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) {
            *target = (byte)uVar11;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar11 | 0x80;
            if (uVar11 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar11 = uVar11 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar11 | 0x80;
                uVar9 = uVar11 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar11;
                uVar11 = uVar9;
              } while (bVar4);
              *pbVar34 = (byte)uVar9;
            }
          }
          if (uVar23 < 0x80) goto LAB_0037f422;
          *pbVar35 = (byte)uVar23 | 0x80;
          uVar27 = uVar23 >> 7;
          if (uVar23 < 0x4000) goto LAB_0037f398;
          target = pbVar35 + 2;
          do {
            *(byte *)((long)target + -1) = (byte)uVar27 | 0x80;
            uVar23 = uVar27 >> 7;
            target = (uint8 *)((long)target + 1);
            bVar4 = 0x3fff < uVar27;
            uVar27 = uVar23;
          } while (bVar4);
LAB_0037f3c4:
          *(byte *)((long)target + -1) = (byte)uVar23;
          break;
        case 5:
          if (*(int *)(field + 0x3c) == 3) {
            uVar11 = Reflection::GetRepeatedInt32(this,message,field,iVar7);
          }
          else {
            uVar11 = Reflection::GetInt32(this,message,field);
          }
          uVar9 = *(int *)(field + 0x44) << 3;
          if (uVar9 < 0x80) {
            *target = (byte)uVar9;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar9 | 0x80;
            if (uVar9 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar9 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar9 = uVar9 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar9 | 0x80;
                uVar25 = uVar9 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar9;
                uVar9 = uVar25;
              } while (bVar4);
              *pbVar34 = (byte)uVar25;
            }
          }
          if (0x7f < uVar11) {
            *pbVar35 = (byte)uVar11 | 0x80;
            uVar27 = (ulong)(long)(int)uVar11 >> 7;
            if (uVar11 < 0x4000) goto LAB_0037f398;
            target = pbVar35 + 2;
            do {
              *(byte *)((long)target + -1) = (byte)uVar27 | 0x80;
              uVar23 = uVar27 >> 7;
              target = (uint8 *)((long)target + 1);
              bVar4 = 0x3fff < uVar27;
              uVar27 = uVar23;
            } while (bVar4);
            goto LAB_0037f3c4;
          }
LAB_0037f1a8:
          *pbVar35 = (byte)uVar11;
          goto LAB_0037f425;
        case 6:
          if (*(int *)(field + 0x3c) == 3) {
            dVar14 = (double)Reflection::GetRepeatedUInt64(this,message,field,iVar7);
          }
          else {
            dVar14 = (double)Reflection::GetUInt64(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) {
LAB_0037eced:
            *target = (byte)uVar11 | 1;
            pdVar31 = (double *)((long)target + 1);
          }
          else {
            *target = (byte)uVar11 | 0x81;
            uVar9 = uVar11 >> 7;
            if (0x3fff < uVar11) {
              pdVar31 = (double *)((long)target + 2);
              do {
                *(byte *)((long)pdVar31 + -1) = (byte)uVar9 | 0x80;
                uVar11 = uVar9 >> 7;
                pdVar31 = (double *)((long)pdVar31 + 1);
                bVar4 = 0x3fff < uVar9;
                uVar9 = uVar11;
              } while (bVar4);
              goto LAB_0037f3eb;
            }
LAB_0037ef63:
            *(byte *)((long)target + 1) = (byte)uVar9;
            pdVar31 = (double *)((long)target + 2);
          }
          goto LAB_0037f3ef;
        case 7:
          if (*(int *)(field + 0x3c) == 3) {
            fVar8 = (float)Reflection::GetRepeatedUInt32(this,message,field,iVar7);
          }
          else {
            fVar8 = (float)Reflection::GetUInt32(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) {
LAB_0037ed50:
            *target = (byte)uVar11 | 5;
            pfVar30 = (float *)((long)target + 1);
          }
          else {
            *target = (byte)uVar11 | 0x85;
            uVar9 = uVar11 >> 7;
            if (0x3fff < uVar11) {
              pfVar30 = (float *)((long)target + 2);
              do {
                *(byte *)((long)pfVar30 + -1) = (byte)uVar9 | 0x80;
                uVar11 = uVar9 >> 7;
                pfVar30 = (float *)((long)pfVar30 + 1);
                bVar4 = 0x3fff < uVar9;
                uVar9 = uVar11;
              } while (bVar4);
              goto LAB_0037f493;
            }
LAB_0037efaf:
            *(byte *)((long)target + 1) = (byte)uVar9;
            pfVar30 = (float *)((long)target + 2);
          }
          goto LAB_0037f497;
        case 8:
          if (*(int *)(field + 0x3c) == 3) {
            bVar4 = Reflection::GetRepeatedBool(this,message,field,iVar7);
          }
          else {
            bVar4 = Reflection::GetBool(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) {
            *target = (byte)uVar11;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar11 | 0x80;
            if (uVar11 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar11 = uVar11 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar11 | 0x80;
                uVar9 = uVar11 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar2 = 0x3fff < uVar11;
                uVar11 = uVar9;
              } while (bVar2);
              *pbVar34 = (byte)uVar9;
            }
          }
          *pbVar35 = bVar4;
          goto LAB_0037f425;
        case 9:
          iVar1 = *(int *)(*(long *)(field + 0x28) + 0x3c);
          local_a8._0_8_ = local_a8 + 0x10;
          local_a8._8_8_ = (MapFieldBase *)0x0;
          local_a8[0x10] = '\0';
          if (*(int *)(field + 0x3c) == 3) {
            psVar13 = Reflection::GetRepeatedStringReference
                                (this,message,field,iVar7,(string *)local_a8);
          }
          else {
            psVar13 = Reflection::GetStringReference(this,message,field,(string *)local_a8);
          }
          if (iVar1 == 3) {
            WireFormatLite::VerifyUtf8String
                      ((psVar13->_M_dataplus)._M_p,(int)psVar13->_M_string_length,SERIALIZE,
                       (char *)**(undefined8 **)(field + 8));
          }
          sVar29 = psVar13->_M_string_length;
          if ((long)sVar29 < 0x80) {
            uVar11 = *(uint32 *)(field + 0x44) * 8;
            if (uVar11 < 0x80) {
              if ((long)(stream->end_ + (0xe - (long)target)) < (long)sVar29) goto LAB_0037f71e;
LAB_0037f073:
              *target = (byte)uVar11 | 2;
              pbVar35 = (byte *)((long)target + 1);
            }
            else {
              lVar22 = 2;
              if ((0x3fff < uVar11) && (lVar22 = 3, 0x1fffff < uVar11)) {
                lVar22 = 5 - (ulong)(uVar11 < 0x10000000);
              }
              if ((long)(stream->end_ + ~(ulong)(lVar22 + (long)target) + 0x10) < (long)sVar29)
              goto LAB_0037f71e;
              if (uVar11 < 0x80) goto LAB_0037f073;
              *target = (byte)uVar11 | 0x82;
              if (uVar11 < 0x4000) {
                *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
                pbVar35 = (byte *)((long)target + 2);
              }
              else {
                pbVar35 = (byte *)((long)target + 2);
                uVar11 = uVar11 >> 7;
                do {
                  pbVar34 = pbVar35;
                  pbVar34[-1] = (byte)uVar11 | 0x80;
                  uVar9 = uVar11 >> 7;
                  pbVar35 = pbVar34 + 1;
                  bVar4 = 0x3fff < uVar11;
                  uVar11 = uVar9;
                } while (bVar4);
                *pbVar34 = (byte)uVar9;
              }
            }
            *pbVar35 = (byte)sVar29;
            memcpy(pbVar35 + 1,(psVar13->_M_dataplus)._M_p,sVar29);
            target = pbVar35 + sVar29 + 1;
          }
          else {
LAB_0037f71e:
            target = io::EpsCopyOutputStream::WriteStringOutline
                               (stream,*(uint32 *)(field + 0x44),psVar13,target);
          }
          goto LAB_0037f091;
        case 10:
          iVar1 = *(int *)(field + 0x44);
          if (*(int *)(field + 0x3c) == 3) {
            if (local_68 == local_70) {
              psVar13 = (string *)Reflection::GetRepeatedMessage(this,message,field,iVar7);
            }
            else {
              psVar13 = ((KeyValue *)&local_68->_vptr_MapFieldBase)[uVar28].string_value_;
            }
          }
          else {
            psVar13 = (string *)Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
          }
          uVar11 = iVar1 << 3;
          bVar24 = (byte)uVar11;
          if (uVar11 < 0x80) {
            *target = bVar24 | 3;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = bVar24 | 0x83;
            if (uVar11 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar9 = uVar11 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar9 | 0x80;
                uVar25 = uVar9 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar9;
                uVar9 = uVar25;
              } while (bVar4);
              *pbVar34 = (byte)uVar25;
            }
          }
          iVar7 = (**(_func_int **)((long)(psVar13->_M_dataplus)._M_p + 0x70))
                            (psVar13,pbVar35,stream);
          pbVar35 = (byte *)CONCAT44(extraout_var,iVar7);
          if (stream->end_ <= pbVar35) {
            pbVar35 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar35);
          }
          if (uVar11 < 0x80) {
            *pbVar35 = bVar24 | 4;
            goto LAB_0037f425;
          }
          *pbVar35 = bVar24 | 0x84;
          if (uVar11 < 0x4000) {
            pbVar35[1] = (byte)(uVar11 >> 7);
            goto LAB_0037f39c;
          }
          target = pbVar35 + 2;
          uVar11 = uVar11 >> 7;
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar11 | 0x80;
            uVar9 = uVar11 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar11;
            uVar11 = uVar9;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar9;
          break;
        case 0xb:
          iVar1 = *(int *)(field + 0x44);
          if (*(int *)(field + 0x3c) == 3) {
            if (local_68 == local_70) {
              psVar13 = (string *)Reflection::GetRepeatedMessage(this,message,field,iVar7);
            }
            else {
              psVar13 = ((KeyValue *)&local_68->_vptr_MapFieldBase)[uVar28].string_value_;
            }
          }
          else {
            psVar13 = (string *)Reflection::GetMessage(this,message,field,(MessageFactory *)0x0);
          }
          uVar11 = iVar1 << 3;
          if (uVar11 < 0x80) {
            *target = (byte)uVar11 | 2;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar11 | 0x82;
            if (uVar11 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar11 = uVar11 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar11 | 0x80;
                uVar9 = uVar11 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar11;
                uVar11 = uVar9;
              } while (bVar4);
              *pbVar34 = (byte)uVar9;
            }
          }
          uVar11 = (**(_func_int **)((long)(psVar13->_M_dataplus)._M_p + 0x60))(psVar13);
          if (uVar11 < 0x80) {
            *pbVar35 = (byte)uVar11;
            pbVar35 = pbVar35 + 1;
          }
          else {
            *pbVar35 = (byte)uVar11 | 0x80;
            if (uVar11 < 0x4000) {
              pbVar35[1] = (byte)(uVar11 >> 7);
              pbVar35 = pbVar35 + 2;
            }
            else {
              pbVar35 = pbVar35 + 2;
              uVar11 = uVar11 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar11 | 0x80;
                uVar9 = uVar11 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar11;
                uVar11 = uVar9;
              } while (bVar4);
              *pbVar34 = (byte)uVar9;
            }
          }
          iVar7 = (**(_func_int **)((long)(psVar13->_M_dataplus)._M_p + 0x70))
                            (psVar13,pbVar35,stream);
          target = (uint8 *)CONCAT44(extraout_var_00,iVar7);
          break;
        case 0xc:
          local_a8._0_8_ = local_a8 + 0x10;
          local_a8._8_8_ = (MapFieldBase *)0x0;
          local_a8[0x10] = '\0';
          if (*(int *)(field + 0x3c) == 3) {
            psVar13 = Reflection::GetRepeatedStringReference
                                (this,message,field,iVar7,(string *)local_a8);
          }
          else {
            psVar13 = Reflection::GetStringReference(this,message,field,(string *)local_a8);
          }
          sVar29 = psVar13->_M_string_length;
          if ((long)sVar29 < 0x80) {
            uVar11 = *(uint32 *)(field + 0x44) * 8;
            if (uVar11 < 0x80) {
              if ((long)(stream->end_ + (0xe - (long)target)) < (long)sVar29) goto LAB_0037f70c;
LAB_0037f009:
              *target = (byte)uVar11 | 2;
              pbVar35 = (byte *)((long)target + 1);
            }
            else {
              lVar22 = 2;
              if ((0x3fff < uVar11) && (lVar22 = 3, 0x1fffff < uVar11)) {
                lVar22 = 5 - (ulong)(uVar11 < 0x10000000);
              }
              if ((long)(stream->end_ + ~(ulong)(lVar22 + (long)target) + 0x10) < (long)sVar29)
              goto LAB_0037f70c;
              if (uVar11 < 0x80) goto LAB_0037f009;
              *target = (byte)uVar11 | 0x82;
              if (uVar11 < 0x4000) {
                *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
                pbVar35 = (byte *)((long)target + 2);
              }
              else {
                pbVar35 = (byte *)((long)target + 2);
                uVar11 = uVar11 >> 7;
                do {
                  pbVar34 = pbVar35;
                  pbVar34[-1] = (byte)uVar11 | 0x80;
                  uVar9 = uVar11 >> 7;
                  pbVar35 = pbVar34 + 1;
                  bVar4 = 0x3fff < uVar11;
                  uVar11 = uVar9;
                } while (bVar4);
                *pbVar34 = (byte)uVar9;
              }
            }
            *pbVar35 = (byte)sVar29;
            memcpy(pbVar35 + 1,(psVar13->_M_dataplus)._M_p,sVar29);
            target = pbVar35 + sVar29 + 1;
          }
          else {
LAB_0037f70c:
            target = io::EpsCopyOutputStream::WriteStringOutline
                               (stream,*(uint32 *)(field + 0x44),psVar13,target);
          }
LAB_0037f091:
          if ((MapKey *)local_a8._0_8_ != (MapKey *)(local_a8 + 0x10)) {
            operator_delete((void *)local_a8._0_8_);
          }
          break;
        case 0xd:
          if (*(int *)(field + 0x3c) == 3) {
            uVar11 = Reflection::GetRepeatedUInt32(this,message,field,iVar7);
          }
          else {
            uVar11 = Reflection::GetUInt32(this,message,field);
          }
          uVar9 = *(int *)(field + 0x44) << 3;
          if (uVar9 < 0x80) {
            *target = (byte)uVar9;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar9 | 0x80;
            if (uVar9 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar9 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar9 = uVar9 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar9 | 0x80;
                uVar25 = uVar9 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar9;
                uVar9 = uVar25;
              } while (bVar4);
              *pbVar34 = (byte)uVar25;
            }
          }
          if (uVar11 < 0x80) goto LAB_0037f1a8;
          *pbVar35 = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          if (uVar11 < 0x4000) {
LAB_0037f1c4:
            pbVar35[1] = (byte)uVar9;
            goto LAB_0037f39c;
          }
          target = pbVar35 + 2;
          do {
            *(byte *)((long)target + -1) = (byte)uVar9 | 0x80;
            uVar11 = uVar9 >> 7;
            target = (uint8 *)((long)target + 1);
            bVar4 = 0x3fff < uVar9;
            uVar9 = uVar11;
          } while (bVar4);
LAB_0037f1e9:
          *(byte *)((long)target + -1) = (byte)uVar11;
          break;
        case 0xe:
          if (*(int *)(field + 0x3c) == 3) {
            pEVar15 = Reflection::GetRepeatedEnum(this,message,field,iVar7);
          }
          else {
            pEVar15 = Reflection::GetEnum(this,message,field);
          }
          uVar11 = *(uint *)(pEVar15 + 0x10);
          uVar23 = (ulong)(int)uVar11;
          uVar9 = *(int *)(field + 0x44) << 3;
          if (uVar9 < 0x80) {
            *target = (byte)uVar9;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar9 | 0x80;
            if (uVar9 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar9 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar9 = uVar9 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar9 | 0x80;
                uVar25 = uVar9 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar9;
                uVar9 = uVar25;
              } while (bVar4);
              *pbVar34 = (byte)uVar25;
            }
          }
          if (uVar11 < 0x80) goto LAB_0037f422;
          *pbVar35 = (byte)uVar11 | 0x80;
          if (uVar11 < 0x4000) {
            pbVar35[1] = (byte)(uVar23 >> 7);
            goto LAB_0037f39c;
          }
          uVar23 = uVar23 >> 7;
          target = pbVar35 + 2;
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar23 | 0x80;
            uVar27 = uVar23 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar23;
            uVar23 = uVar27;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar27;
          break;
        case 0xf:
          if (*(int *)(field + 0x3c) == 3) {
            fVar8 = (float)Reflection::GetRepeatedInt32(this,message,field,iVar7);
          }
          else {
            fVar8 = (float)Reflection::GetInt32(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) goto LAB_0037ed50;
          *target = (byte)uVar11 | 0x85;
          uVar9 = uVar11 >> 7;
          if (uVar11 < 0x4000) goto LAB_0037efaf;
          pfVar30 = (float *)((long)target + 2);
          do {
            *(byte *)((long)pfVar30 + -1) = (byte)uVar9 | 0x80;
            uVar11 = uVar9 >> 7;
            pfVar30 = (float *)((long)pfVar30 + 1);
            bVar4 = 0x3fff < uVar9;
            uVar9 = uVar11;
          } while (bVar4);
LAB_0037f493:
          *(byte *)((long)pfVar30 + -1) = (byte)uVar11;
LAB_0037f497:
          *pfVar30 = fVar8;
LAB_0037f49a:
          target = (uint8 *)(pfVar30 + 1);
          break;
        case 0x10:
          if (*(int *)(field + 0x3c) == 3) {
            dVar14 = (double)Reflection::GetRepeatedInt64(this,message,field,iVar7);
          }
          else {
            dVar14 = (double)Reflection::GetInt64(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) goto LAB_0037eced;
          *target = (byte)uVar11 | 0x81;
          uVar9 = uVar11 >> 7;
          if (uVar11 < 0x4000) goto LAB_0037ef63;
          pdVar31 = (double *)((long)target + 2);
          do {
            *(byte *)((long)pdVar31 + -1) = (byte)uVar9 | 0x80;
            uVar11 = uVar9 >> 7;
            pdVar31 = (double *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar9;
            uVar9 = uVar11;
          } while (bVar4);
LAB_0037f3eb:
          *(byte *)((long)pdVar31 + -1) = (byte)uVar11;
LAB_0037f3ef:
          *pdVar31 = dVar14;
LAB_0037f3f2:
          target = (uint8 *)(pdVar31 + 1);
          break;
        case 0x11:
          if (*(int *)(field + 0x3c) == 3) {
            iVar7 = Reflection::GetRepeatedInt32(this,message,field,iVar7);
          }
          else {
            iVar7 = Reflection::GetInt32(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) {
            *target = (byte)uVar11;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar11 | 0x80;
            if (uVar11 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar11 = uVar11 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar11 | 0x80;
                uVar9 = uVar11 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar11;
                uVar11 = uVar9;
              } while (bVar4);
              *pbVar34 = (byte)uVar9;
            }
          }
          uVar11 = iVar7 >> 0x1f ^ iVar7 * 2;
          uVar23 = (ulong)uVar11;
          if (0x7f < uVar11) {
            *pbVar35 = (byte)uVar11 | 0x80;
            uVar9 = uVar11 >> 7;
            if (uVar11 < 0x4000) goto LAB_0037f1c4;
            target = pbVar35 + 2;
            do {
              *(byte *)((long)target + -1) = (byte)uVar9 | 0x80;
              uVar11 = uVar9 >> 7;
              target = (uint8 *)((long)target + 1);
              bVar4 = 0x3fff < uVar9;
              uVar9 = uVar11;
            } while (bVar4);
            goto LAB_0037f1e9;
          }
          goto LAB_0037f422;
        case 0x12:
          if (*(int *)(field + 0x3c) == 3) {
            lVar22 = Reflection::GetRepeatedInt64(this,message,field,iVar7);
          }
          else {
            lVar22 = Reflection::GetInt64(this,message,field);
          }
          uVar11 = *(int *)(field + 0x44) << 3;
          if (uVar11 < 0x80) {
            *target = (byte)uVar11;
            pbVar35 = (byte *)((long)target + 1);
          }
          else {
            *target = (byte)uVar11 | 0x80;
            if (uVar11 < 0x4000) {
              *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
              pbVar35 = (byte *)((long)target + 2);
            }
            else {
              pbVar35 = (byte *)((long)target + 2);
              uVar11 = uVar11 >> 7;
              do {
                pbVar34 = pbVar35;
                pbVar34[-1] = (byte)uVar11 | 0x80;
                uVar9 = uVar11 >> 7;
                pbVar35 = pbVar34 + 1;
                bVar4 = 0x3fff < uVar11;
                uVar11 = uVar9;
              } while (bVar4);
              *pbVar34 = (byte)uVar9;
            }
          }
          uVar23 = lVar22 >> 0x3f ^ lVar22 * 2;
          if (0x7f < uVar23) {
            *pbVar35 = (byte)uVar23 | 0x80;
            uVar27 = uVar23 >> 7;
            if (uVar23 < 0x4000) goto LAB_0037f398;
            target = pbVar35 + 2;
            do {
              *(byte *)((long)target + -1) = (byte)uVar27 | 0x80;
              uVar23 = uVar27 >> 7;
              target = (uint8 *)((long)target + 1);
              bVar4 = 0x3fff < uVar27;
              uVar27 = uVar23;
            } while (bVar4);
            goto LAB_0037f3c4;
          }
LAB_0037f422:
          *pbVar35 = (byte)uVar23;
LAB_0037f425:
          target = pbVar35 + 1;
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar6);
    }
    goto LAB_003801a5;
  }
  if (uVar6 == 0) goto LAB_003801a5;
  if (stream->end_ <= target) {
    target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_a8._0_8_ = FieldDescriptor::TypeOnceInit;
    local_60.iter_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_a8,
               (FieldDescriptor **)&local_60);
  }
  switch(*(undefined4 *)(field + 0x38)) {
  case 1:
    other = Reflection::GetRepeatedField<double>(this,message,field);
    RepeatedField<double>::RepeatedField((RepeatedField<double> *)local_a8,other);
    iVar7 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = local_a8._0_4_ << 3;
    uVar11 = iVar7 << 3;
    if (uVar11 < 0x80) {
      *target = (byte)uVar11 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar11 | 0x82;
      if (uVar11 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar11 = uVar11 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar4);
        *pbVar34 = (byte)uVar9;
      }
    }
    uVar11 = uVar6;
    uVar9 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar35 = (byte)uVar9 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar9;
        uVar11 = uVar9 >> 7;
        uVar9 = uVar9 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar11;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar6;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_a8._8_8_,uVar6,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_a8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    RepeatedField<double>::~RepeatedField((RepeatedField<double> *)local_a8);
    break;
  case 2:
    other_00 = Reflection::GetRepeatedField<float>(this,message,field);
    RepeatedField<float>::RepeatedField((RepeatedField<float> *)local_a8,other_00);
    iVar7 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = local_a8._0_4_ << 2;
    uVar11 = iVar7 << 3;
    if (uVar11 < 0x80) {
      *target = (byte)uVar11 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar11 | 0x82;
      if (uVar11 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar11 = uVar11 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar4);
        *pbVar34 = (byte)uVar9;
      }
    }
    uVar11 = uVar6;
    uVar9 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar35 = (byte)uVar9 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar9;
        uVar11 = uVar9 >> 7;
        uVar9 = uVar9 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar11;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar6;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_a8._8_8_,uVar6,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_a8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    RepeatedField<float>::~RepeatedField((RepeatedField<float> *)local_a8);
    break;
  case 3:
    pRVar17 = Reflection::GetRepeatedField<long>(this,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)local_a8,pRVar17);
    iVar7 = *(int *)(field + 0x44);
    sVar18 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = iVar7 << 3;
    if (uVar6 < 0x80) {
      *target = (byte)uVar6 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar6 | 0x82;
      if (uVar6 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar6 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar6 = uVar6 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar6 | 0x80;
          uVar11 = uVar6 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar11;
        } while (bVar4);
        *pbVar34 = (byte)uVar11;
      }
    }
    if ((uint)sVar18 < 0x80) {
      uVar28 = sVar18 & 0xffffffff;
    }
    else {
      uVar28 = sVar18 & 0xffffffff;
      do {
        uVar6 = (uint)sVar18;
        *pbVar35 = (byte)sVar18 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar18 = uVar28;
      } while (0x3fff < uVar6);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar22 = (long)(int)local_a8._0_4_;
    pKVar3 = (KeyValue *)local_a8._8_8_;
    pMVar12 = (MapFieldBase *)local_a8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar28 = ((KeyValue *)&pMVar12->_vptr_MapFieldBase)->uint64_value_;
      if (uVar28 < 0x80) {
        *target = (byte)uVar28;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar28 | 0x80;
        if (uVar28 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)(uVar28 >> 7);
          target = (uint8 *)((long)target + 2);
        }
        else {
          uVar28 = uVar28 >> 7;
          target = (uint8 *)((long)target + 2);
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar28 | 0x80;
            uVar23 = uVar28 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar28;
            uVar28 = uVar23;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar23;
        }
      }
      pMVar12 = (MapFieldBase *)&pMVar12->arena_;
    } while (pMVar12 < pKVar3 + lVar22);
    goto LAB_0037fff6;
  case 4:
    pRVar20 = Reflection::GetRepeatedField<unsigned_long>(this,message,field);
    RepeatedField<unsigned_long>::RepeatedField((RepeatedField<unsigned_long> *)local_a8,pRVar20);
    iVar7 = *(int *)(field + 0x44);
    sVar18 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = iVar7 << 3;
    if (uVar6 < 0x80) {
      *target = (byte)uVar6 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar6 | 0x82;
      if (uVar6 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar6 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar6 = uVar6 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar6 | 0x80;
          uVar11 = uVar6 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar11;
        } while (bVar4);
        *pbVar34 = (byte)uVar11;
      }
    }
    if ((uint)sVar18 < 0x80) {
      uVar28 = sVar18 & 0xffffffff;
    }
    else {
      uVar28 = sVar18 & 0xffffffff;
      do {
        uVar6 = (uint)sVar18;
        *pbVar35 = (byte)sVar18 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar18 = uVar28;
      } while (0x3fff < uVar6);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar22 = (long)(int)local_a8._0_4_;
    pKVar3 = (KeyValue *)local_a8._8_8_;
    pMVar12 = (MapFieldBase *)local_a8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar28 = ((KeyValue *)&pMVar12->_vptr_MapFieldBase)->uint64_value_;
      if (uVar28 < 0x80) {
        *target = (byte)uVar28;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar28 | 0x80;
        if (uVar28 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)(uVar28 >> 7);
          target = (uint8 *)((long)target + 2);
        }
        else {
          uVar28 = uVar28 >> 7;
          target = (uint8 *)((long)target + 2);
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar28 | 0x80;
            uVar23 = uVar28 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar28;
            uVar28 = uVar23;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar23;
        }
      }
      pMVar12 = (MapFieldBase *)&pMVar12->arena_;
    } while (pMVar12 < pKVar3 + lVar22);
    goto LAB_0037ff8c;
  case 5:
    pRVar19 = Reflection::GetRepeatedField<int>(this,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)local_a8,pRVar19);
    iVar7 = *(int *)(field + 0x44);
    sVar18 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = iVar7 << 3;
    if (uVar6 < 0x80) {
      *target = (byte)uVar6 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar6 | 0x82;
      if (uVar6 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar6 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar6 = uVar6 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar6 | 0x80;
          uVar11 = uVar6 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar11;
        } while (bVar4);
        *pbVar34 = (byte)uVar11;
      }
    }
    if ((uint)sVar18 < 0x80) {
      uVar28 = sVar18 & 0xffffffff;
    }
    else {
      uVar28 = sVar18 & 0xffffffff;
      do {
        uVar6 = (uint)sVar18;
        *pbVar35 = (byte)sVar18 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar18 = uVar28;
      } while (0x3fff < uVar6);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar22 = (long)(int)local_a8._0_4_;
    pKVar3 = (KeyValue *)local_a8._8_8_;
    pMVar12 = (MapFieldBase *)local_a8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar6 = ((KeyValue *)&pMVar12->_vptr_MapFieldBase)->uint32_value_;
      if ((ulong)(long)(int)uVar6 < 0x80) {
        *target = (byte)uVar6;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar6 | 0x80;
        uVar28 = (ulong)(long)(int)uVar6 >> 7;
        if (uVar6 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)uVar28;
          target = (uint8 *)((long)target + 2);
        }
        else {
          target = (uint8 *)((long)target + 2);
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar28 | 0x80;
            uVar23 = uVar28 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar28;
            uVar28 = uVar23;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar23;
        }
      }
      pMVar12 = (MapFieldBase *)((long)&pMVar12->_vptr_MapFieldBase + 4);
    } while (pMVar12 < (MapFieldBase *)((long)pKVar3 + lVar22 * 4));
    goto LAB_0037ff22;
  case 6:
    pRVar20 = Reflection::GetRepeatedField<unsigned_long>(this,message,field);
    RepeatedField<unsigned_long>::RepeatedField((RepeatedField<unsigned_long> *)local_a8,pRVar20);
    iVar7 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = local_a8._0_4_ << 3;
    uVar11 = iVar7 << 3;
    if (uVar11 < 0x80) {
      *target = (byte)uVar11 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar11 | 0x82;
      if (uVar11 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar11 = uVar11 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar4);
        *pbVar34 = (byte)uVar9;
      }
    }
    uVar11 = uVar6;
    uVar9 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar35 = (byte)uVar9 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar9;
        uVar11 = uVar9 >> 7;
        uVar9 = uVar9 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar11;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar6;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_a8._8_8_,uVar6,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_a8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
LAB_0037ff8c:
    RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)local_a8);
    break;
  case 7:
    pRVar21 = Reflection::GetRepeatedField<unsigned_int>(this,message,field);
    RepeatedField<unsigned_int>::RepeatedField((RepeatedField<unsigned_int> *)local_a8,pRVar21);
    iVar7 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = local_a8._0_4_ << 2;
    uVar11 = iVar7 << 3;
    if (uVar11 < 0x80) {
      *target = (byte)uVar11 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar11 | 0x82;
      if (uVar11 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar11 = uVar11 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar4);
        *pbVar34 = (byte)uVar9;
      }
    }
    uVar11 = uVar6;
    uVar9 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar35 = (byte)uVar9 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar9;
        uVar11 = uVar9 >> 7;
        uVar9 = uVar9 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar11;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar6;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_a8._8_8_,uVar6,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_a8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    goto LAB_00380134;
  case 8:
    other_01 = Reflection::GetRepeatedField<bool>(this,message,field);
    RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)local_a8,other_01);
    iVar7 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = iVar7 << 3;
    if (uVar6 < 0x80) {
      *target = (byte)uVar6 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar6 | 0x82;
      if (uVar6 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar6 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar6 = uVar6 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar6 | 0x80;
          uVar11 = uVar6 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar11;
        } while (bVar4);
        *pbVar34 = (byte)uVar11;
      }
    }
    sVar29 = (size_t)(int)local_a8._0_4_;
    LVar10 = local_a8._0_4_;
    LVar26 = local_a8._0_4_;
    if (0x7f < (uint)local_a8._0_4_) {
      do {
        *pbVar35 = (byte)LVar26 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < LVar26;
        LVar10 = LVar26 >> 7;
        LVar26 = LVar26 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)LVar10;
    pbVar35 = pbVar35 + 1;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_a8._8_8_,local_a8._0_4_,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_a8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)local_a8);
    break;
  default:
    LogMessage::LogMessage
              ((LogMessage *)local_a8,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x3ac);
    other_02 = LogMessage::operator<<((LogMessage *)local_a8,"Invalid descriptor");
    LogFinisher::operator=((LogFinisher *)&local_60,other_02);
    LogMessage::~LogMessage((LogMessage *)local_a8);
    break;
  case 0xd:
    pRVar21 = Reflection::GetRepeatedField<unsigned_int>(this,message,field);
    RepeatedField<unsigned_int>::RepeatedField((RepeatedField<unsigned_int> *)local_a8,pRVar21);
    iVar7 = *(int *)(field + 0x44);
    sVar18 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = iVar7 << 3;
    if (uVar6 < 0x80) {
      *target = (byte)uVar6 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar6 | 0x82;
      if (uVar6 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar6 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar6 = uVar6 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar6 | 0x80;
          uVar11 = uVar6 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar11;
        } while (bVar4);
        *pbVar34 = (byte)uVar11;
      }
    }
    if ((uint)sVar18 < 0x80) {
      uVar28 = sVar18 & 0xffffffff;
    }
    else {
      uVar28 = sVar18 & 0xffffffff;
      do {
        uVar6 = (uint)sVar18;
        *pbVar35 = (byte)sVar18 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar18 = uVar28;
      } while (0x3fff < uVar6);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar22 = (long)(int)local_a8._0_4_;
    pKVar3 = (KeyValue *)local_a8._8_8_;
    pMVar12 = (MapFieldBase *)local_a8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar6 = ((KeyValue *)&pMVar12->_vptr_MapFieldBase)->uint32_value_;
      if (uVar6 < 0x80) {
        *target = (byte)uVar6;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar6 | 0x80;
        if (uVar6 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)(uVar6 >> 7);
          target = (uint8 *)((long)target + 2);
        }
        else {
          target = (uint8 *)((long)target + 2);
          uVar6 = uVar6 >> 7;
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar6 | 0x80;
            uVar11 = uVar6 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar6;
            uVar6 = uVar11;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar11;
        }
      }
      pMVar12 = (MapFieldBase *)((long)&pMVar12->_vptr_MapFieldBase + 4);
    } while (pMVar12 < (MapFieldBase *)((long)pKVar3 + lVar22 * 4));
LAB_00380134:
    RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)local_a8);
    break;
  case 0xe:
    pRVar19 = Reflection::GetRepeatedField<int>(this,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)local_a8,pRVar19);
    iVar7 = *(int *)(field + 0x44);
    sVar18 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = iVar7 << 3;
    if (uVar6 < 0x80) {
      *target = (byte)uVar6 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar6 | 0x82;
      if (uVar6 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar6 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar6 = uVar6 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar6 | 0x80;
          uVar11 = uVar6 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar11;
        } while (bVar4);
        *pbVar34 = (byte)uVar11;
      }
    }
    if ((uint)sVar18 < 0x80) {
      uVar28 = sVar18 & 0xffffffff;
    }
    else {
      uVar28 = sVar18 & 0xffffffff;
      do {
        uVar6 = (uint)sVar18;
        *pbVar35 = (byte)sVar18 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar18 = uVar28;
      } while (0x3fff < uVar6);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar22 = (long)(int)local_a8._0_4_;
    pKVar3 = (KeyValue *)local_a8._8_8_;
    pMVar12 = (MapFieldBase *)local_a8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar6 = ((KeyValue *)&pMVar12->_vptr_MapFieldBase)->uint32_value_;
      if ((ulong)(long)(int)uVar6 < 0x80) {
        *target = (byte)uVar6;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar6 | 0x80;
        uVar28 = (ulong)(long)(int)uVar6 >> 7;
        if (uVar6 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)uVar28;
          target = (uint8 *)((long)target + 2);
        }
        else {
          target = (uint8 *)((long)target + 2);
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar28 | 0x80;
            uVar23 = uVar28 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar28;
            uVar28 = uVar23;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar23;
        }
      }
      pMVar12 = (MapFieldBase *)((long)&pMVar12->_vptr_MapFieldBase + 4);
    } while (pMVar12 < (MapFieldBase *)((long)pKVar3 + lVar22 * 4));
    goto LAB_0037ff22;
  case 0xf:
    pRVar19 = Reflection::GetRepeatedField<int>(this,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)local_a8,pRVar19);
    iVar7 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = local_a8._0_4_ << 2;
    uVar11 = iVar7 << 3;
    if (uVar11 < 0x80) {
      *target = (byte)uVar11 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar11 | 0x82;
      if (uVar11 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar11 = uVar11 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar4);
        *pbVar34 = (byte)uVar9;
      }
    }
    uVar11 = uVar6;
    uVar9 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar35 = (byte)uVar9 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar9;
        uVar11 = uVar9 >> 7;
        uVar9 = uVar9 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar11;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar6;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_a8._8_8_,uVar6,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_a8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    goto LAB_0037ff22;
  case 0x10:
    pRVar17 = Reflection::GetRepeatedField<long>(this,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)local_a8,pRVar17);
    iVar7 = *(int *)(field + 0x44);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = local_a8._0_4_ << 3;
    uVar11 = iVar7 << 3;
    if (uVar11 < 0x80) {
      *target = (byte)uVar11 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar11 | 0x82;
      if (uVar11 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar11 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar11 = uVar11 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar4);
        *pbVar34 = (byte)uVar9;
      }
    }
    uVar11 = uVar6;
    uVar9 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar35 = (byte)uVar9 | 0x80;
        pbVar35 = pbVar35 + 1;
        bVar4 = 0x3fff < uVar9;
        uVar11 = uVar9 >> 7;
        uVar9 = uVar9 >> 7;
      } while (bVar4);
    }
    *pbVar35 = (byte)uVar11;
    pbVar35 = pbVar35 + 1;
    sVar29 = (size_t)(int)uVar6;
    if ((long)stream->end_ - (long)pbVar35 < (long)sVar29) {
      target = io::EpsCopyOutputStream::WriteRawFallback
                         (stream,(void *)local_a8._8_8_,uVar6,pbVar35);
    }
    else {
      memcpy(pbVar35,(void *)local_a8._8_8_,sVar29);
      target = pbVar35 + sVar29;
    }
    goto LAB_0037fff6;
  case 0x11:
    pRVar19 = Reflection::GetRepeatedField<int>(this,message,field);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)local_a8,pRVar19);
    iVar7 = *(int *)(field + 0x44);
    sVar18 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = iVar7 << 3;
    if (uVar6 < 0x80) {
      *target = (byte)uVar6 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar6 | 0x82;
      if (uVar6 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar6 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar6 = uVar6 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar6 | 0x80;
          uVar11 = uVar6 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar11;
        } while (bVar4);
        *pbVar34 = (byte)uVar11;
      }
    }
    if ((uint)sVar18 < 0x80) {
      uVar28 = sVar18 & 0xffffffff;
    }
    else {
      uVar28 = sVar18 & 0xffffffff;
      do {
        uVar6 = (uint)sVar18;
        *pbVar35 = (byte)sVar18 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar18 = uVar28;
      } while (0x3fff < uVar6);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar22 = (long)(int)local_a8._0_4_;
    pKVar3 = (KeyValue *)local_a8._8_8_;
    pMVar12 = (MapFieldBase *)local_a8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar6 = ((KeyValue *)&pMVar12->_vptr_MapFieldBase)->int32_value_ >> 0x1f ^
              ((KeyValue *)&pMVar12->_vptr_MapFieldBase)->int32_value_ * 2;
      if (uVar6 < 0x80) {
        *target = (byte)uVar6;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar6 | 0x80;
        if (uVar6 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)(uVar6 >> 7);
          target = (uint8 *)((long)target + 2);
        }
        else {
          target = (uint8 *)((long)target + 2);
          uVar6 = uVar6 >> 7;
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar6 | 0x80;
            uVar11 = uVar6 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar6;
            uVar6 = uVar11;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar11;
        }
      }
      pMVar12 = (MapFieldBase *)((long)&pMVar12->_vptr_MapFieldBase + 4);
    } while (pMVar12 < (MapFieldBase *)((long)pKVar3 + lVar22 * 4));
LAB_0037ff22:
    RepeatedField<int>::~RepeatedField((RepeatedField<int> *)local_a8);
    break;
  case 0x12:
    pRVar17 = Reflection::GetRepeatedField<long>(this,message,field);
    RepeatedField<long>::RepeatedField((RepeatedField<long> *)local_a8,pRVar17);
    iVar7 = *(int *)(field + 0x44);
    sVar18 = FieldDataOnlyByteSize(field,message);
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar6 = iVar7 << 3;
    if (uVar6 < 0x80) {
      *target = (byte)uVar6 | 2;
      pbVar35 = (byte *)((long)target + 1);
    }
    else {
      *target = (byte)uVar6 | 0x82;
      if (uVar6 < 0x4000) {
        *(byte *)((long)target + 1) = (byte)(uVar6 >> 7);
        pbVar35 = (byte *)((long)target + 2);
      }
      else {
        pbVar35 = (byte *)((long)target + 2);
        uVar6 = uVar6 >> 7;
        do {
          pbVar34 = pbVar35;
          pbVar34[-1] = (byte)uVar6 | 0x80;
          uVar11 = uVar6 >> 7;
          pbVar35 = pbVar34 + 1;
          bVar4 = 0x3fff < uVar6;
          uVar6 = uVar11;
        } while (bVar4);
        *pbVar34 = (byte)uVar11;
      }
    }
    if ((uint)sVar18 < 0x80) {
      uVar28 = sVar18 & 0xffffffff;
    }
    else {
      uVar28 = sVar18 & 0xffffffff;
      do {
        uVar6 = (uint)sVar18;
        *pbVar35 = (byte)sVar18 | 0x80;
        uVar28 = uVar28 >> 7;
        pbVar35 = pbVar35 + 1;
        sVar18 = uVar28;
      } while (0x3fff < uVar6);
    }
    *pbVar35 = (byte)uVar28;
    target = pbVar35 + 1;
    lVar22 = (long)(int)local_a8._0_4_;
    pKVar3 = (KeyValue *)local_a8._8_8_;
    pMVar12 = (MapFieldBase *)local_a8._8_8_;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar28 = ((KeyValue *)&pMVar12->_vptr_MapFieldBase)->int64_value_ >> 0x3f ^
               ((KeyValue *)&pMVar12->_vptr_MapFieldBase)->int64_value_ * 2;
      if (uVar28 < 0x80) {
        *target = (byte)uVar28;
        target = (uint8 *)((long)target + 1);
      }
      else {
        *target = (byte)uVar28 | 0x80;
        if (uVar28 < 0x4000) {
          *(byte *)((long)target + 1) = (byte)(uVar28 >> 7);
          target = (uint8 *)((long)target + 2);
        }
        else {
          uVar28 = uVar28 >> 7;
          target = (uint8 *)((long)target + 2);
          do {
            pdVar31 = (double *)target;
            *(byte *)((long)pdVar31 + -1) = (byte)uVar28 | 0x80;
            uVar23 = uVar28 >> 7;
            target = (uint8 *)((long)pdVar31 + 1);
            bVar4 = 0x3fff < uVar28;
            uVar28 = uVar23;
          } while (bVar4);
          *(byte *)pdVar31 = (byte)uVar23;
        }
      }
      pMVar12 = (MapFieldBase *)&pMVar12->arena_;
    } while (pMVar12 < pKVar3 + lVar22);
LAB_0037fff6:
    RepeatedField<long>::~RepeatedField((RepeatedField<long> *)local_a8);
  }
LAB_003801a5:
  if (local_68 != (MapFieldBase *)0x0) {
    operator_delete(local_68);
  }
  return (uint8 *)(double *)target;
}

Assistant:

uint8* WireFormat::InternalSerializeField(const FieldDescriptor* field,
                                          const Message& message, uint8* target,
                                          io::EpsCopyOutputStream* stream) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return InternalSerializeMessageSetItem(field, message, target, stream);
  }

  // For map fields, we can use either repeated field reflection or map
  // reflection.  Our choice has some subtle effects.  If we use repeated field
  // reflection here, then the repeated field representation becomes
  // authoritative for this field: any existing references that came from map
  // reflection remain valid for reading, but mutations to them are lost and
  // will be overwritten next time we call map reflection!
  //
  // So far this mainly affects Python, which keeps long-term references to map
  // values around, and always uses map reflection.  See: b/35918691
  //
  // Here we choose to use map reflection API as long as the internal
  // map is valid. In this way, the serialization doesn't change map field's
  // internal state and existing references that came from map reflection remain
  // valid for both reading and writing.
  if (field->is_map()) {
    const MapFieldBase* map_field =
        message_reflection->GetMapData(message, field);
    if (map_field->IsMapValid()) {
      if (stream->IsSerializationDeterministic()) {
        std::vector<MapKey> sorted_key_list =
            MapKeySorter::SortKey(message, message_reflection, field);
        for (std::vector<MapKey>::iterator it = sorted_key_list.begin();
             it != sorted_key_list.end(); ++it) {
          MapValueRef map_value;
          message_reflection->InsertOrLookupMapValue(
              const_cast<Message*>(&message), field, *it, &map_value);
          target =
              InternalSerializeMapEntry(field, *it, map_value, target, stream);
        }
      } else {
        for (MapIterator it = message_reflection->MapBegin(
                 const_cast<Message*>(&message), field);
             it !=
             message_reflection->MapEnd(const_cast<Message*>(&message), field);
             ++it) {
          target = InternalSerializeMapEntry(field, it.GetKey(),
                                             it.GetValueRef(), target, stream);
        }
      }

      return target;
    }
  }
  int count = 0;

  if (field->is_repeated()) {
    count = message_reflection->FieldSize(message, field);
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  // map_entries is for maps that'll be deterministically serialized.
  std::vector<const Message*> map_entries;
  if (count > 1 && field->is_map() && stream->IsSerializationDeterministic()) {
    map_entries =
        DynamicMapSorter::Sort(message, count, message_reflection, field);
  }

  if (field->is_packed()) {
    if (count == 0) return target;
    stream->EnsureSpace(&target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    auto r = message_reflection->GetRepeatedField<CPPTYPE>(message, field); \
    target = stream->Write##TYPE_METHOD##Packed(                            \
        field->number(), r, FieldDataOnlyByteSize(field, message), target); \
    break;                                                                  \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)
      HANDLE_PRIMITIVE_TYPE(ENUM, int, Enum, Enum)

#undef HANDLE_PRIMITIVE_TYPE
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)   \
  case FieldDescriptor::TYPE_##TYPE: {                                      \
    auto r = message_reflection->GetRepeatedField<CPPTYPE>(message, field); \
    target = stream->WriteFixedPacked(field->number(), r, target);          \
    break;                                                                  \
  }

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE
      default:
        GOOGLE_LOG(FATAL) << "Invalid descriptor";
    }
    return target;
  }

  for (int j = 0; j < count; j++) {
    stream->EnsureSpace(&target);
    switch (field->type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, CPPTYPE, TYPE_METHOD, CPPTYPE_METHOD)     \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    const CPPTYPE value =                                                     \
        field->is_repeated()                                                  \
            ? message_reflection->GetRepeated##CPPTYPE_METHOD(message, field, \
                                                              j)              \
            : message_reflection->Get##CPPTYPE_METHOD(message, field);        \
    target = WireFormatLite::Write##TYPE_METHOD##ToArray(field->number(),     \
                                                         value, target);      \
    break;                                                                    \
  }

      HANDLE_PRIMITIVE_TYPE(INT32, int32, Int32, Int32)
      HANDLE_PRIMITIVE_TYPE(INT64, int64, Int64, Int64)
      HANDLE_PRIMITIVE_TYPE(SINT32, int32, SInt32, Int32)
      HANDLE_PRIMITIVE_TYPE(SINT64, int64, SInt64, Int64)
      HANDLE_PRIMITIVE_TYPE(UINT32, uint32, UInt32, UInt32)
      HANDLE_PRIMITIVE_TYPE(UINT64, uint64, UInt64, UInt64)

      HANDLE_PRIMITIVE_TYPE(FIXED32, uint32, Fixed32, UInt32)
      HANDLE_PRIMITIVE_TYPE(FIXED64, uint64, Fixed64, UInt64)
      HANDLE_PRIMITIVE_TYPE(SFIXED32, int32, SFixed32, Int32)
      HANDLE_PRIMITIVE_TYPE(SFIXED64, int64, SFixed64, Int64)

      HANDLE_PRIMITIVE_TYPE(FLOAT, float, Float, Float)
      HANDLE_PRIMITIVE_TYPE(DOUBLE, double, Double, Double)

      HANDLE_PRIMITIVE_TYPE(BOOL, bool, Bool, Bool)
#undef HANDLE_PRIMITIVE_TYPE

#define HANDLE_TYPE(TYPE, TYPE_METHOD, CPPTYPE_METHOD)                         \
  case FieldDescriptor::TYPE_##TYPE:                                           \
    target = WireFormatLite::InternalWrite##TYPE_METHOD##ToArray(              \
        field->number(),                                                       \
        field->is_repeated()                                                   \
            ? (map_entries.empty()                                             \
                   ? message_reflection->GetRepeated##CPPTYPE_METHOD(message,  \
                                                                     field, j) \
                   : *map_entries[j])                                          \
            : message_reflection->Get##CPPTYPE_METHOD(message, field),         \
        target, stream);                                                       \
    break;

      HANDLE_TYPE(GROUP, Group, Message)
      HANDLE_TYPE(MESSAGE, Message, Message)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        const EnumValueDescriptor* value =
            field->is_repeated()
                ? message_reflection->GetRepeatedEnum(message, field, j)
                : message_reflection->GetEnum(message, field);
        target = WireFormatLite::WriteEnumToArray(field->number(),
                                                  value->number(), target);
        break;
      }

      // Handle strings separately so that we can get string references
      // instead of copying.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        if (strict_utf8_check) {
          WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                           WireFormatLite::SERIALIZE,
                                           field->full_name().c_str());
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), SERIALIZE,
                                     field->full_name().c_str());
        }
        target = stream->WriteString(field->number(), value, target);
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string scratch;
        const std::string& value =
            field->is_repeated()
                ? message_reflection->GetRepeatedStringReference(message, field,
                                                                 j, &scratch)
                : message_reflection->GetStringReference(message, field,
                                                         &scratch);
        target = stream->WriteString(field->number(), value, target);
        break;
      }
    }
  }
  return target;
}